

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<bool>::add_sample(TypedTimeSamples<bool> *this,double t,bool *v)

{
  Sample s;
  Sample local_18;
  
  local_18.blocked = false;
  local_18.value = *v;
  local_18.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<bool>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
              *)this,&local_18);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }